

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O3

void __thiscall
CppUnit::TestFactoryRegistry::addTestToSuite(TestFactoryRegistry *this,TestSuite *suite)

{
  Test *test;
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_factories)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    test = (Test *)(**(code **)(**(long **)(p_Var1 + 1) + 0x10))();
    TestSuite::addTest(suite,test);
  }
  return;
}

Assistant:

void 
TestFactoryRegistry::addTestToSuite( TestSuite *suite )
{
  for ( Factories::iterator it = m_factories.begin(); 
        it != m_factories.end(); 
        ++it )
  {
    TestFactory *factory = *it;
    suite->addTest( factory->makeTest() );
  }
}